

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::updateCurrentDateTime(DateTimePickerPrivate *this)

{
  Type TVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference pSVar5;
  QTime local_7c;
  QDate local_78;
  QDateTime local_70 [8];
  undefined8 local_68;
  int local_5c;
  int local_58;
  int i;
  int amPm;
  undefined4 local_4c;
  int msecs;
  undefined4 local_44;
  int second;
  undefined4 local_3c;
  int minute;
  int local_34;
  int hour;
  int day;
  int local_24;
  undefined8 uStack_20;
  int month;
  int local_14;
  DateTimePickerPrivate *pDStack_10;
  int year;
  DateTimePickerPrivate *this_local;
  
  pDStack_10 = this;
  uStack_20 = QDateTime::date();
  local_14 = QDate::year();
  _hour = QDateTime::date();
  local_24 = QDate::month();
  local_34 = -1;
  local_3c = QDateTime::time();
  minute = QTime::hour();
  local_44 = QDateTime::time();
  second = QTime::minute();
  local_4c = QDateTime::time();
  msecs = QTime::second();
  i = QDateTime::time();
  amPm = QTime::msec();
  local_58 = -1;
  for (local_5c = 0; lVar3 = (long)local_5c,
      qVar4 = QList<QtMWidgets::Section>::size(&(this->super_DateTimeParser).sections),
      lVar3 < qVar4; local_5c = local_5c + 1) {
    pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c);
    TVar1 = pSVar5->type;
    if (TVar1 == AmPmSection) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      local_58 = pSVar5->currentIndex;
    }
    else if (TVar1 == SecondSection) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      msecs = pSVar5->currentIndex;
    }
    else if (TVar1 == MinuteSection) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      second = pSVar5->currentIndex;
    }
    else if ((TVar1 == Hour12Section) || (TVar1 == Hour24Section)) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      minute = pSVar5->currentIndex;
    }
    else if (((TVar1 == DaySection) || (TVar1 == DaySectionShort)) || (TVar1 == DaySectionLong)) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      local_34 = pSVar5->currentIndex + 1;
    }
    else if (((TVar1 == MonthSection) || (TVar1 == MonthSectionShort)) ||
            (TVar1 == MonthSectionLong)) {
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      local_24 = pSVar5->currentIndex + 1;
    }
    else if ((TVar1 == YearSection) || (TVar1 == YearSection2Digits)) {
      local_68 = QDateTime::date();
      iVar2 = QDate::year();
      pSVar5 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_5c)
      ;
      local_14 = iVar2 + pSVar5->currentIndex;
    }
  }
  if (local_34 == -1) {
    local_34 = 1;
  }
  if (local_58 == 0) {
    if (minute == 0xb) {
      minute = 0;
    }
    else {
      minute = minute + 1;
    }
  }
  else if (local_58 == 1) {
    if (minute == 0xb) {
      minute = 0xc;
    }
    else {
      minute = minute + 0xd;
    }
  }
  QDate::QDate(&local_78,local_14,local_24,local_34);
  QTime::QTime(&local_7c,minute,second,msecs,amPm);
  QDateTime::QDateTime(local_70,local_78,local_7c,this->spec,0);
  setValue(this,local_70,false);
  QDateTime::~QDateTime(local_70);
  return;
}

Assistant:

void
DateTimePickerPrivate::updateCurrentDateTime()
{
	int year = value.date().year();
	int month = value.date().month();
	int day = -1;
	int hour = value.time().hour();
	int minute = value.time().minute();
	int second = value.time().second();
	int msecs = value.time().msec();
	int amPm = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		switch( sections.at( i ).type )
		{
			case Section::AmPmSection :
			{
				amPm = sections.at( i ).currentIndex;
			}
			break;

			case Section::SecondSection :
			{
				second = sections.at( i ).currentIndex;
			}
			break;

			case Section::MinuteSection :
			{
				minute = sections.at( i ).currentIndex;
			}
			break;

			case Section::Hour12Section :
			case Section::Hour24Section :
			{
				hour = sections.at( i ).currentIndex;
			}
			break;

			case Section::DaySection :
			case Section::DaySectionShort :
			case Section::DaySectionLong :
			{
				day = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::MonthSection :
			case Section::MonthSectionShort :
			case Section::MonthSectionLong :
			{
				month = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::YearSection :
			case Section::YearSection2Digits :
			{
				year = minimum.date().year() + sections.at( i ).currentIndex;
			}
			break;

			default:
				break;
		}
	}

	if( day == -1 )
		day = 1;

	if( amPm == 0 )
	{
		if( hour == 11 )
			hour = 0;
		else
			hour += 1;
	}
	else if( amPm == 1 )
	{
		if( hour == 11 )
			hour = 12;
		else
			hour += 12 + 1;
	}

	setValue( QDateTime( QDate( year, month, day ),
		QTime( hour, minute, second, msecs ), spec ), false );
}